

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [8];
  int local_60;
  REF_INT local_5c;
  REF_INT local_58 [10];
  
  local_58[4] = 4;
  local_58[5] = 5;
  local_58[6] = 6;
  local_58[7] = 7;
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  local_58[3] = 3;
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x43a,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_60 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_60 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,1,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x43f,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    pRVar3[(long)local_60 * 0xf] = 1.0;
    pRVar3 = pRVar3 + (long)local_60 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    uVar4 = ref_node_add(ref_node,2,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x444,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,3,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x449,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,4,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x44e,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_60 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_60 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,5,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x453,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 0.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,6,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x458,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,7,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x45d,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_cell_add(pRVar1->cell[0xb],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x462,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add prism");
      return uVar4;
    }
    local_58[0] = 0;
    local_58[1] = 1;
    local_58[2] = 2;
    local_58[3] = 3;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x469,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 1;
    local_58[1] = 5;
    local_58[2] = 6;
    local_58[3] = 2;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x479,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 0;
    local_58[1] = 3;
    local_58[2] = 7;
    local_58[3] = 4;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x480,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 0;
    local_58[1] = 4;
    local_58[2] = 5;
    local_58[3] = 1;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x487,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 2;
    local_58[1] = 6;
    local_58[2] = 7;
    local_58[3] = 3;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x48e,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    uVar4 = ref_node_add(ref_node,8,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x490,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_60 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_60 * 0xf + 2] = 2.0;
    uVar4 = ref_node_add(ref_node,9,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x495,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 0.0;
    pRVar3[lVar5 * 0xf + 2] = 2.0;
    uVar4 = ref_node_add(ref_node,10,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x49a,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 2.0;
    uVar4 = ref_node_add(ref_node,0xb,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x49f,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_60;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 2.0;
    local_58[0] = 4;
    local_58[1] = 5;
    local_58[2] = 7;
    local_58[3] = 8;
    local_58[4] = 9;
    local_58[5] = 0xb;
    uVar4 = ref_cell_add(pRVar1->cell[10],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4aa,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 5;
    local_58[1] = 6;
    local_58[2] = 7;
    local_58[3] = 9;
    local_58[4] = 10;
    local_58[5] = 0xb;
    uVar4 = ref_cell_add(pRVar1->cell[10],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4b2,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 5;
    local_58[1] = 9;
    local_58[2] = 10;
    local_58[3] = 6;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4b9,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 4;
    local_58[1] = 7;
    local_58[2] = 0xb;
    local_58[3] = 8;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4c0,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 4;
    local_58[1] = 8;
    local_58[2] = 9;
    local_58[3] = 5;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4c7,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 6;
    local_58[1] = 10;
    local_58[2] = 0xb;
    local_58[3] = 7;
    local_58[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4ce,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 8;
    local_58[1] = 0xb;
    local_58[2] = 9;
    local_58[3] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[3],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4d4,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_58[0] = 9;
    local_58[1] = 0xb;
    local_58[2] = 10;
    local_58[3] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[3],local_58,&local_5c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x4da,"ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    uVar4 = ref_node_initialize_n_global(ref_node,0xc);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar7 = "init glob";
    uVar6 = 0x4dc;
  }
  else {
    pcVar7 = "create";
    uVar6 = 0x436;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6,
         "ref_fixture_hanging_hex_pri_grid",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID *ref_grid_ptr,
                                                    REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[8] = {0, 1, 2, 3, 4, 5, 6, 7};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 5, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 6, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 7, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &cell), "add prism");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  /*
  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 6;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");
  */

  nodes[0] = 1;
  nodes[1] = 5;
  nodes[2] = 6;
  nodes[3] = 2;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 7;
  nodes[3] = 4;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 4;
  nodes[2] = 5;
  nodes[3] = 1;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 2;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_add(ref_node, 8, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 9, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 10, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 11, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  nodes[0] = 4;
  nodes[1] = 5;
  nodes[2] = 7;
  nodes[3] = 8;
  nodes[4] = 9;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 9;
  nodes[4] = 10;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 9;
  nodes[2] = 10;
  nodes[3] = 6;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 11;
  nodes[3] = 8;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 8;
  nodes[2] = 9;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 6;
  nodes[1] = 10;
  nodes[2] = 11;
  nodes[3] = 7;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 8;
  nodes[1] = 11;
  nodes[2] = 9;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 9;
  nodes[1] = 11;
  nodes[2] = 10;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_initialize_n_global(ref_node, 12), "init glob");

  return REF_SUCCESS;
}